

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Contacts.cc
# Opt level: O0

uint __thiscall
RigidBodyDynamics::ConstraintSet::AddConstraint
          (ConstraintSet *this,uint body_id,Vector3d *body_point,Vector3d *world_normal,
          char *constraint_name,double normal_acceleration)

{
  uint uVar1;
  Index IVar2;
  Scalar *pSVar3;
  vector<Vector3_t,_std::allocator<Vector3_t>_> *this_00;
  value_type *__value;
  allocator_type *__a;
  char *in_R8;
  Scalar in_XMM0_Qa;
  uint n_constr;
  string name_str;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *in_stack_ffffffffffffff10;
  value_type *in_stack_ffffffffffffff18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff20;
  string local_50 [32];
  Scalar local_30;
  char *local_28;
  
  local_30 = in_XMM0_Qa;
  local_28 = in_R8;
  std::__cxx11::string::string(local_50);
  if (local_28 != (char *)0x0) {
    std::__cxx11::string::operator=(local_50,local_28);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff20,
             (value_type_conflict *)in_stack_ffffffffffffff18);
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::push_back
            ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)in_stack_ffffffffffffff20,
             (value_type *)in_stack_ffffffffffffff18);
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::push_back
            ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)in_stack_ffffffffffffff20,
             (value_type *)in_stack_ffffffffffffff18);
  IVar2 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_ffffffffffffff10
                    );
  uVar1 = (uint)IVar2;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_ffffffffffffff10,
             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     (in_stack_ffffffffffffff10,
                      CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  *pSVar3 = local_30;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_ffffffffffffff10,
             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  this_00 = (vector<Vector3_t,_std::allocator<Vector3_t>_> *)
            Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                      (in_stack_ffffffffffffff10,
                       CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  (this_00->super__Vector_base<Vector3_t,_std::allocator<Vector3_t>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_ffffffffffffff10,
             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     (in_stack_ffffffffffffff10,
                      CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  *pSVar3 = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_ffffffffffffff10,
             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  __value = (value_type *)
            Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                      (in_stack_ffffffffffffff10,
                       CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  (__value->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[0] = 0.0;
  __a = (allocator_type *)(ulong)(uVar1 + 1);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Vector3_t::
  Vector3_t<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((Vector3_t *)in_stack_ffffffffffffff10,
             (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  std::allocator<Vector3_t>::allocator((allocator<Vector3_t> *)0x14b810);
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::vector(this_00,(size_type)pSVar3,__value,__a);
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::operator=
            ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)__value,
             (vector<Vector3_t,_std::allocator<Vector3_t>_> *)__a);
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::~vector
            ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)__value);
  std::allocator<Vector3_t>::~allocator((allocator<Vector3_t> *)0x14b85e);
  std::__cxx11::string::~string(local_50);
  return uVar1;
}

Assistant:

unsigned int ConstraintSet::AddConstraint (
		unsigned int body_id,
		const Vector3d &body_point,
		const Vector3d &world_normal,
		const char *constraint_name,
		double normal_acceleration) {
	assert (bound == false);

	std::string name_str;
	if (constraint_name != NULL)
		name_str = constraint_name;

	name.push_back (name_str);
	body.push_back (body_id);
	point.push_back (body_point);
	normal.push_back (world_normal);

	unsigned int n_constr = acceleration.size() + 1;

	acceleration.conservativeResize (n_constr);
	acceleration[n_constr - 1] = normal_acceleration;

	force.conservativeResize (n_constr);
	force[n_constr - 1] = 0.;

	impulse.conservativeResize (n_constr);
	impulse[n_constr - 1] = 0.;

	v_plus.conservativeResize (n_constr);
	v_plus[n_constr - 1] = 0.;

	d_multdof3_u = std::vector<Math::Vector3d> (n_constr, Math::Vector3d::Zero());

	return n_constr - 1;
}